

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O0

void opengv::getPerturbedPose
               (translation_t *position,rotation_t *rotation,translation_t *perturbedPosition,
               rotation_t *perturbedRotation,double amplitude)

{
  Scalar SVar1;
  int iVar2;
  Scalar *pSVar3;
  ulong in_XMM0_Qa;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  size_t i;
  cayley_t cayley;
  Matrix<double,_3,_3,_0,_3,_3> *in_stack_ffffffffffffff48;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_stack_ffffffffffffff50;
  undefined8 local_48;
  
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffff50,
             (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffff48);
  math::rot2cayley(perturbedRotation);
  for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (in_stack_ffffffffffffff50,(Index)in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff50 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)*pSVar3;
    iVar2 = rand();
    auVar8._8_8_ = 0;
    auVar8._0_8_ = in_stack_ffffffffffffff50;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = in_XMM0_Qa;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = ((double)iVar2 / 2147483647.0 - 0.5) * 2.0;
    auVar4 = vfmadd213sd_fma(auVar4,auVar6,auVar8);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (in_stack_ffffffffffffff50,(Index)in_stack_ffffffffffffff48);
    *pSVar3 = auVar4._0_8_;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (in_stack_ffffffffffffff50,(Index)in_stack_ffffffffffffff48);
    SVar1 = *pSVar3;
    iVar2 = rand();
    auVar9._8_8_ = 0;
    auVar9._0_8_ = SVar1;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = in_XMM0_Qa;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = ((double)iVar2 / 2147483647.0 - 0.5) * 2.0;
    auVar4 = vfmadd213sd_fma(auVar5,auVar7,auVar9);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (in_stack_ffffffffffffff50,(Index)in_stack_ffffffffffffff48);
    *pSVar3 = auVar4._0_8_;
  }
  math::cayley2rot((cayley_t *)
                   cayley.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0]);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  return;
}

Assistant:

void
opengv::getPerturbedPose(
    const translation_t & position,
    const rotation_t & rotation,
    translation_t & perturbedPosition,
    rotation_t & perturbedRotation,
    double amplitude )
{
  perturbedPosition = position;
  cayley_t cayley = math::rot2cayley(rotation);
  for( size_t i = 0; i < 3; i++ )
  {
    perturbedPosition[i] =
        perturbedPosition[i] +
        (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0*amplitude;
    cayley[i] =
        cayley[i] + (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0*amplitude;
  }
  perturbedRotation = math::cayley2rot(cayley);
}